

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

drmModePropertyPtr __thiscall
QKmsDevice::connectorProperty(QKmsDevice *this,drmModeConnectorPtr connector,QByteArray *name)

{
  int iVar1;
  drmModePropertyPtr p_Var2;
  long lVar3;
  char *__s2;
  
  if (0 < connector->count_props) {
    lVar3 = 0;
    do {
      p_Var2 = (drmModePropertyPtr)drmModeGetProperty(this->m_dri_fd,connector->props[lVar3]);
      if (p_Var2 != (drmModePropertyPtr)0x0) {
        __s2 = (name->d).ptr;
        if (__s2 == (char *)0x0) {
          __s2 = (char *)&QByteArray::_empty;
        }
        iVar1 = strcmp(p_Var2->name,__s2);
        if (iVar1 == 0) {
          return p_Var2;
        }
        drmModeFreeProperty(p_Var2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < connector->count_props);
  }
  return (drmModePropertyPtr)0x0;
}

Assistant:

drmModePropertyPtr QKmsDevice::connectorProperty(drmModeConnectorPtr connector, const QByteArray &name)
{
    drmModePropertyPtr prop;

    for (int i = 0; i < connector->count_props; i++) {
        prop = drmModeGetProperty(m_dri_fd, connector->props[i]);
        if (!prop)
            continue;
        if (strcmp(prop->name, name.constData()) == 0)
            return prop;
        drmModeFreeProperty(prop);
    }

    return nullptr;
}